

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.c
# Opt level: O2

_Bool sysbvm_io_writeWholeFileNamedWithByteArray(sysbvm_tuple_t filename,sysbvm_tuple_t content)

{
  _Bool _Var1;
  char *__filename;
  FILE *__s;
  size_t sVar2;
  _Bool _Var3;
  
  __filename = sysbvm_tuple_bytesToCString(filename);
  __s = fopen(__filename,"wb");
  if (__s == (FILE *)0x0) {
    _Var3 = false;
  }
  else {
    sysbvm_tuple_bytesToCStringFree(__filename);
    _Var1 = sysbvm_tuple_isBytes(content);
    _Var3 = true;
    if (_Var1) {
      if ((content & 0xf) == 0 && content != 0) {
        sVar2 = (size_t)*(uint *)(content + 0xc);
      }
      else {
        sVar2 = 0;
      }
      sVar2 = fwrite((void *)(content + 0x10),sVar2,1,__s);
      _Var3 = sVar2 == 1;
    }
    fclose(__s);
  }
  return _Var3;
}

Assistant:

SYSBVM_API bool sysbvm_io_writeWholeFileNamedWithByteArray(sysbvm_tuple_t filename, sysbvm_tuple_t content)
{
    char *outputFileName = sysbvm_tuple_bytesToCString(filename);
#ifdef _WIN32
    FILE *outputFile = NULL;
    if(fopen_s(&outputFile, outputFileName, "wb"))
        return false;
#else
    FILE *outputFile = fopen(outputFileName, "wb");
#endif
    if(!outputFile)
        return false;
    sysbvm_tuple_bytesToCStringFree(outputFileName);

    bool success = true;
    if(sysbvm_tuple_isBytes(content))
    {
        size_t contentSize = sysbvm_tuple_getSizeInBytes(content);
        success = fwrite(SYSBVM_CAST_OOP_TO_OBJECT_TUPLE(content)->bytes, contentSize, 1, outputFile) == 1;
    }
    fclose(outputFile);

    return success;
}